

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::skipSpacesInSource(Forth *this)

{
  byte bVar1;
  Cell CVar2;
  Cell CVar3;
  int iVar4;
  
  CVar2 = this->VarOffsetSourceSize;
  while( true ) {
    CVar2 = dataSpaceAtCell(this,CVar2);
    CVar3 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
    if ((int)(CVar2 - CVar3) < 1) {
      return;
    }
    CVar2 = dataSpaceAtCell(this,this->VarOffsetSourceAddress);
    CVar3 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
    bVar1 = dataSpaceAt(this,CVar2 + CVar3);
    iVar4 = isspace((uint)bVar1);
    if (iVar4 == 0) break;
    incSourceBufferOffset(this);
    CVar2 = this->VarOffsetSourceSize;
  }
  return;
}

Assistant:

void  skipSpacesInSource() {
				// Skip leading delimiters
				while(getSourceBufferRemain() > 0) {
					auto currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());
					if (std::isspace(static_cast<unsigned char>(currentChar))) {
						incSourceBufferOffset();
					} else {
						return;
					}
				}
		}